

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

_Bool player_timed_grade_eq(player *p,wchar_t idx,char *match)

{
  int iVar1;
  timed_grade *local_30;
  timed_grade *grade;
  char *match_local;
  wchar_t idx_local;
  player *p_local;
  
  if (p->timed[idx] != 0) {
    for (local_30 = timed_effects[idx].grade; local_30->max < (int)p->timed[idx];
        local_30 = local_30->next) {
    }
    if ((local_30->name != (char *)0x0) && (iVar1 = strcmp(local_30->name,match), iVar1 == 0)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool player_timed_grade_eq(struct player *p, int idx, const char *match)
{
	if (p->timed[idx]) {
		struct timed_grade *grade = timed_effects[idx].grade;
		while (p->timed[idx] > grade->max) {
			grade = grade->next;
		}
		if (grade->name && streq(grade->name, match)) return true;
	}

	return false;
}